

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argize.c
# Opt level: O3

int countargs(char *cmdline)

{
  byte *pbVar1;
  byte bVar2;
  ushort **ppuVar3;
  int iVar4;
  
  bVar2 = *cmdline;
  if (bVar2 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    do {
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (ulong)bVar2 * 2 + 1) & 0x20) == 0) {
LAB_001fab3c:
        iVar4 = iVar4 + 1;
        __ctype_b_loc();
        cmdline = (char *)((byte *)cmdline + 1);
      }
      else {
        do {
          pbVar1 = (byte *)cmdline + 1;
          cmdline = (char *)((byte *)cmdline + 1);
        } while ((*(byte *)((long)*ppuVar3 + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
        if (*pbVar1 != 0) goto LAB_001fab3c;
      }
      bVar2 = *cmdline;
    } while (bVar2 != 0);
  }
  return iVar4;
}

Assistant:

int countargs(const char *cmdline)
{
    const char *p = cmdline;
    int                     state = 0;
    int                     argc = 0;

    while (*p) {
        switch (state) {
        case 0:                                 /* skip leading white space */
            while (isspace((unsigned char)*p)) p++;
            if (!*p) break;            /* If there's nothing left, get out. */
            state = 1;
            /* fall through */;

        case 1:                                                /* begin arg */
            argc++;
            state = 2;
            /* fall through */

        case 2:                            /* collect chars for current arg */
            if (isspace((unsigned char)*p))
                p++, state = 0;                       /* Terminate this arg */
            else if (*p == '"')
                p++, state = 3;                              /* Open quote. */
            else if (*p == '\\')
                p++, state = 4;                         /* Escape sequence. */
            else
                p++;                                    /* Just keep going. */

            break;

        case 3:                             /* collect chars inside quotes. */
            switch (*p) {
            case '"' : p++; state = 2; break;                /* Close quote */
            case '\\': p++; state = 5; break;           /* Escape sequence. */
            default:   p++; break;
            }
            break;

        case 4:                        /* escaped character outside quotes. */
            p++; state = 2;
            break;

        case 5:                         /* escaped character inside quotes. */
            p++; state = 3;
            break;
        }
    }

    return argc;
}